

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O2

void add_array_member_fn(File *file,CopyFuncType copy,char *format,uint data,int last)

{
  char **ppcVar1;
  
  if (file->binary == 0) {
    myfprintf(file->fp,"%d",(ulong)format & 0xffffffff);
    if (data == 0) {
      myfprintf(file->fp,", ");
      return;
    }
  }
  else {
    add_array_member_internal(file);
    (*copy)((file->tables).cur,(int)format);
    ppcVar1 = &(file->tables).cur;
    *ppcVar1 = *ppcVar1 + file->elem_size;
  }
  return;
}

Assistant:

static void add_array_member_fn(File *file, CopyFuncType copy, char *format, uint data, int last) {
  if (file->binary) {
    add_array_member_internal(file);
    copy((void *)(file->tables.cur), data);
    file->tables.cur += file->elem_size;
  } else {
    fprintf((file)->fp, format, data);
    if (!last) fprintf(file->fp, ", ");
  }
}